

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_update_info(bcf_hdr_t *hdr,bcf1_t *line,char *key,void *values,int n,int type)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint8_t *ptr_00;
  bcf_info_t *pbVar4;
  bcf_info_t *local_78;
  int t;
  int vptr_free;
  uint8_t *ptr;
  kstring_t str;
  bcf_info_t *inf;
  int inf_id;
  int i;
  int type_local;
  int n_local;
  void *values_local;
  char *key_local;
  bcf1_t *line_local;
  bcf_hdr_t *hdr_local;
  
  iVar2 = bcf_hdr_id2int(hdr,0,key);
  if ((iVar2 < 0) || (((hdr->id[0][iVar2].val)->info[1] & 0xf) == 0xf)) {
    hdr_local._4_4_ = -1;
  }
  else {
    if ((line->unpacked & 4U) == 0) {
      bcf_unpack(line,4);
    }
    inf._4_4_ = 0;
    while (((int)inf._4_4_ < (int)((uint)*(undefined8 *)&line->field_0x10 & 0xffff) &&
           (iVar2 != (line->d).info[(int)inf._4_4_].key))) {
      inf._4_4_ = inf._4_4_ + 1;
    }
    if (inf._4_4_ == ((uint)*(undefined8 *)&line->field_0x10 & 0xffff)) {
      local_78 = (bcf_info_t *)0x0;
    }
    else {
      local_78 = (line->d).info + (int)inf._4_4_;
    }
    str.s = (char *)local_78;
    if ((n == 0) || ((type == 3 && (values == (void *)0x0)))) {
      if (local_78 != (bcf_info_t *)0x0) {
        if (*(int *)&local_78->field_0x1c < 0) {
          free(local_78->vptr + -(long)(int)(*(uint *)&local_78->field_0x1c & 0x7fffffff));
          *(uint *)(str.s + 0x1c) = *(uint *)(str.s + 0x1c) & 0x7fffffff;
        }
        (line->d).shared_dirty = (line->d).shared_dirty | 8;
        str.s[0x10] = '\0';
        str.s[0x11] = '\0';
        str.s[0x12] = '\0';
        str.s[0x13] = '\0';
        str.s[0x14] = '\0';
        str.s[0x15] = '\0';
        str.s[0x16] = '\0';
        str.s[0x17] = '\0';
      }
      hdr_local._4_4_ = 0;
    }
    else {
      memset(&ptr,0,0x18);
      bcf_enc_int1((kstring_t *)&ptr,iVar2);
      if (type == 1) {
        bcf_enc_vint((kstring_t *)&ptr,n,(int32_t *)values,-1);
      }
      else if (type == 2) {
        bcf_enc_vfloat((kstring_t *)&ptr,n,(float *)values);
      }
      else {
        if ((type != 0) && (type != 3)) {
          fprintf(_stderr,"[E::%s] the type %d not implemented yet\n","bcf_update_info",
                  (ulong)(uint)type);
          abort();
        }
        if (values == (void *)0x0) {
          bcf_enc_size((kstring_t *)&ptr,0,0);
        }
        else {
          sVar3 = strlen((char *)values);
          bcf_enc_vchar((kstring_t *)&ptr,(int)sVar3,(char *)values);
        }
      }
      if (str.s == (char *)0x0) {
        *(ulong *)&line->field_0x10 =
             *(ulong *)&line->field_0x10 & 0xffffffffffff0000 |
             (ulong)(((uint)*(undefined8 *)&line->field_0x10 & 0xffff) + 1) & 0xffff;
        if ((line->d).m_info < (int)((uint)*(undefined8 *)&line->field_0x10 & 0xffff)) {
          iVar2 = (line->d).m_info;
          (line->d).m_info = (uint)*(undefined8 *)&line->field_0x10 & 0xffff;
          (line->d).m_info = (line->d).m_info + -1;
          (line->d).m_info = (line->d).m_info >> 1 | (line->d).m_info;
          (line->d).m_info = (line->d).m_info >> 2 | (line->d).m_info;
          (line->d).m_info = (line->d).m_info >> 4 | (line->d).m_info;
          (line->d).m_info = (line->d).m_info >> 8 | (line->d).m_info;
          (line->d).m_info = (line->d).m_info >> 0x10 | (line->d).m_info;
          (line->d).m_info = (line->d).m_info + 1;
          pbVar4 = (bcf_info_t *)realloc((line->d).info,(long)(line->d).m_info << 5);
          (line->d).info = pbVar4;
          memset((line->d).info + iVar2,0,(long)((line->d).m_info - iVar2) << 5);
        }
        str.s = (char *)((line->d).info +
                        (int)(((uint)*(undefined8 *)&line->field_0x10 & 0xffff) - 1));
        bcf_unpack_info_core1((uint8_t *)str.m,(bcf_info_t *)str.s);
        *(uint *)(str.s + 0x1c) = *(uint *)(str.s + 0x1c) & 0x7fffffff | 0x80000000;
        (line->d).shared_dirty = (line->d).shared_dirty | 8;
      }
      else if ((uint8_t *)(ulong)(*(int *)(str.s + 0x18) + (*(uint *)(str.s + 0x1c) & 0x7fffffff)) <
               ptr) {
        if (*(int *)(str.s + 0x1c) < 0) {
          __assert_fail("!inf->vptr_free",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                        ,0xa95,
                        "int bcf_update_info(const bcf_hdr_t *, bcf1_t *, const char *, const void *, int, int)"
                       );
        }
        bcf_unpack_info_core1((uint8_t *)str.m,(bcf_info_t *)str.s);
        *(uint *)(str.s + 0x1c) = *(uint *)(str.s + 0x1c) & 0x7fffffff | 0x80000000;
        (line->d).shared_dirty = (line->d).shared_dirty | 8;
      }
      else {
        if (ptr != (uint8_t *)
                   (ulong)(*(int *)(str.s + 0x18) + (*(uint *)(str.s + 0x1c) & 0x7fffffff))) {
          (line->d).shared_dirty = (line->d).shared_dirty | 8;
        }
        ptr_00 = (uint8_t *)
                 (*(long *)(str.s + 0x10) - (long)(int)(*(uint *)(str.s + 0x1c) & 0x7fffffff));
        memcpy(ptr_00,(void *)str.m,(size_t)ptr);
        free((void *)str.m);
        uVar1 = *(uint *)(str.s + 0x1c);
        bcf_unpack_info_core1(ptr_00,(bcf_info_t *)str.s);
        *(uint *)(str.s + 0x1c) = *(uint *)(str.s + 0x1c) & 0x7fffffff | uVar1 & 0x80000000;
      }
      line->unpacked = line->unpacked | 4;
      hdr_local._4_4_ = 0;
    }
  }
  return hdr_local._4_4_;
}

Assistant:

int bcf_update_info(const bcf_hdr_t *hdr, bcf1_t *line, const char *key, const void *values, int n, int type)
{
    // Is the field already present?
    int i, inf_id = bcf_hdr_id2int(hdr,BCF_DT_ID,key);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_INFO,inf_id) ) return -1;    // No such INFO field in the header
    if ( !(line->unpacked & BCF_UN_INFO) ) bcf_unpack(line, BCF_UN_INFO);

    for (i=0; i<line->n_info; i++)
        if ( inf_id==line->d.info[i].key ) break;
    bcf_info_t *inf = i==line->n_info ? NULL : &line->d.info[i];

    if ( !n || (type==BCF_HT_STR && !values) )
    {
        if ( inf )
        {
            // Mark the tag for removal, free existing memory if necessary
            if ( inf->vptr_free )
            {
                free(inf->vptr - inf->vptr_off);
                inf->vptr_free = 0;
            }
            line->d.shared_dirty |= BCF1_DIRTY_INF;
            inf->vptr = NULL;
        }
        return 0;
    }

    // Encode the values and determine the size required to accommodate the values
    kstring_t str = {0,0,0};
    bcf_enc_int1(&str, inf_id);
    if ( type==BCF_HT_INT )
        bcf_enc_vint(&str, n, (int32_t*)values, -1);
    else if ( type==BCF_HT_REAL )
        bcf_enc_vfloat(&str, n, (float*)values);
    else if ( type==BCF_HT_FLAG || type==BCF_HT_STR )
    {
        if ( values==NULL )
            bcf_enc_size(&str, 0, BCF_BT_NULL);
        else
            bcf_enc_vchar(&str, strlen((char*)values), (char*)values);
    }
    else
    {
        fprintf(stderr, "[E::%s] the type %d not implemented yet\n", __func__, type);
        abort();
    }

    // Is the INFO tag already present
    if ( inf )
    {
        // Is it big enough to accommodate new block?
        if ( str.l <= inf->vptr_len + inf->vptr_off )
        {
            if ( str.l != inf->vptr_len + inf->vptr_off ) line->d.shared_dirty |= BCF1_DIRTY_INF;
            uint8_t *ptr = inf->vptr - inf->vptr_off;
            memcpy(ptr, str.s, str.l);
            free(str.s);
            int vptr_free = inf->vptr_free;
            bcf_unpack_info_core1(ptr, inf);
            inf->vptr_free = vptr_free;
        }
        else
        {
            assert( !inf->vptr_free );  // fix the caller or improve here: this has been modified before
            bcf_unpack_info_core1((uint8_t*)str.s, inf);
            inf->vptr_free = 1;
            line->d.shared_dirty |= BCF1_DIRTY_INF;
        }
    }
    else
    {
        // The tag is not present, create new one
        line->n_info++;
        hts_expand0(bcf_info_t, line->n_info, line->d.m_info , line->d.info);
        inf = &line->d.info[line->n_info-1];
        bcf_unpack_info_core1((uint8_t*)str.s, inf);
        inf->vptr_free = 1;
        line->d.shared_dirty |= BCF1_DIRTY_INF;
    }
    line->unpacked |= BCF_UN_INFO;
    return 0;
}